

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O2

log_map log_map_create(size_t size)

{
  undefined8 *puVar1;
  size_t sVar2;
  log_map __ptr;
  log_map_bucket_conflict __ptr_00;
  long lVar3;
  log_map_bucket_conflict *pplVar4;
  ulong uVar5;
  size_t sVar6;
  
  sVar2 = log_valid_size(size);
  uVar5 = 0x10000;
  if (sVar2 < 0x10000) {
    uVar5 = sVar2;
  }
  sVar2 = 0x100;
  if (0x100 < uVar5) {
    sVar2 = uVar5;
  }
  __ptr = (log_map)malloc(0x38);
  if (__ptr != (log_map)0x0) {
    __ptr_00 = (log_map_bucket_conflict)malloc(sVar2 * 0x18);
    (__ptr->table).data = __ptr_00;
    if (__ptr_00 != (log_map_bucket_conflict)0x0) {
      (__ptr->table).count = 0;
      (__ptr->table).size = sVar2;
      for (lVar3 = 0; sVar2 * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
        puVar1 = (undefined8 *)((long)&__ptr_00->key + lVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&__ptr_00->next + lVar3) = 0;
      }
      pplVar4 = (log_map_bucket_conflict *)malloc(sVar2 * 8);
      (__ptr->block).data = pplVar4;
      if (pplVar4 != (log_map_bucket_conflict *)0x0) {
        (__ptr->block).count = 0;
        (__ptr->block).size = sVar2;
        (__ptr->block).position = 0x100;
        for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
          pplVar4[sVar6] = (log_map_bucket_conflict)0x0;
        }
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (log_map)0x0;
}

Assistant:

log_map log_map_create(size_t size)
{
	size_t iterator;

	log_map map = NULL;

	size = log_valid_size(size);

	if (size < LOG_MAP_MIN_SIZE)
	{
		size = LOG_MAP_MIN_SIZE;
	}
	else if (size > LOG_MAP_MAX_SIZE)
	{
		size = LOG_MAP_MAX_SIZE;
	}

	map = malloc(sizeof(struct log_map_type));

	if (map == NULL)
	{
		return NULL;
	}

	map->table.data = malloc(sizeof(struct log_map_bucket_type) * size);

	if (map->table.data == NULL)
	{
		free(map);

		return NULL;
	}

	map->table.count = 0;
	map->table.size = size;

	for (iterator = 0; iterator < map->table.size; ++iterator)
	{
		log_map_bucket bucket = &map->table.data[iterator];

		bucket->key = NULL;
		bucket->value = NULL;
		bucket->next = NULL;
	}

	map->block.data = malloc(sizeof(log_map_bucket) * size);

	if (map->block.data == NULL)
	{
		free(map->table.data);

		free(map);

		return NULL;
	}

	map->block.count = 0;
	map->block.size = size;
	map->block.position = LOG_MAP_BUCKET_SIZE;

	for (iterator = 0; iterator < map->block.size; ++iterator)
	{
		map->block.data[iterator] = NULL;
	}

	return map;
}